

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_t * stateless_hrr_prepare(ptls_buffer_t *sbuf,ptls_handshake_properties_t *server_hs_prop)

{
  int iVar1;
  ptls_t *tls;
  size_t sStack_50;
  int ret;
  size_t consumed;
  ptls_buffer_t cbuf;
  ptls_t *server;
  ptls_t *client;
  ptls_handshake_properties_t *server_hs_prop_local;
  ptls_buffer_t *sbuf_local;
  
  tls = ptls_new(ctx,0);
  cbuf._24_8_ = ptls_new(ctx_peer,1);
  ptls_buffer_init((ptls_buffer_t *)&consumed,"",0);
  ptls_buffer_init(sbuf,"",0);
  iVar1 = ptls_handshake(tls,(ptls_buffer_t *)&consumed,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x446)
  ;
  sStack_50 = cbuf.capacity;
  iVar1 = ptls_handshake((ptls_t *)cbuf._24_8_,sbuf,(void *)consumed,&stack0xffffffffffffffb0,
                         server_hs_prop);
  _ok((uint)(iVar1 == 0x206),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x44a)
  ;
  ptls_buffer_dispose((ptls_buffer_t *)&consumed);
  ptls_free((ptls_t *)cbuf._24_8_);
  return tls;
}

Assistant:

static ptls_t *stateless_hrr_prepare(ptls_buffer_t *sbuf, ptls_handshake_properties_t *server_hs_prop)
{
    ptls_t *client = ptls_new(ctx, 0), *server = ptls_new(ctx_peer, 1);
    ptls_buffer_t cbuf;
    size_t consumed;
    int ret;

    ptls_buffer_init(&cbuf, "", 0);
    ptls_buffer_init(sbuf, "", 0);

    ret = ptls_handshake(client, &cbuf, NULL, NULL, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);

    consumed = cbuf.off;
    ret = ptls_handshake(server, sbuf, cbuf.base, &consumed, server_hs_prop);
    ok(ret == PTLS_ERROR_STATELESS_RETRY);

    ptls_buffer_dispose(&cbuf);
    ptls_free(server);

    return client;
}